

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<asd::Data<short,_asd::channel<2UL>,_asd::version<0UL>,_asd::container::vec>_> * __thiscall
pybind11::class_<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>>::
def_readwrite<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>,std::array<std::vector<asd::Frame<short,asd::container::vec>,std::allocator<asd::Frame<short,asd::container::vec>>>,2ul>,char_const*>
          (class_<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>> *this,
          char *name,offset_in_Header<asd::version<0UL>_>_to_int pm,char **extra)

{
  return_value_policy local_65 [13];
  is_method local_58;
  type local_50;
  cpp_function local_48;
  cpp_function fset;
  type local_38;
  cpp_function local_30;
  cpp_function fget;
  char **extra_local;
  offset_in_Header<asd::version<0UL>_>_to_int pm_local;
  char *name_local;
  class_<asd::Data<short,_asd::channel<2UL>,_asd::version<0UL>,_asd::container::vec>_> *this_local;
  
  local_38.pm = pm;
  fget.super_function.super_object.super_handle.m_ptr = (function)(function)extra;
  is_method::is_method((is_method *)&fset,(handle *)this);
  cpp_function::
  cpp_function<pybind11::class_<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>>::def_readwrite<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>,std::array<std::vector<asd::Frame<short,asd::container::vec>,std::allocator<asd::Frame<short,asd::container::vec>>>,2ul>,char_const*>(char_const*,std::array<std::vector<asd::Frame<short,asd::container::vec>,std::allocator<asd::Frame<short,asd::container::vec>>>,2ul>asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>::*,char_const*const&)::_lambda(asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>const&)_1_,pybind11::is_method,void>
            (&local_30,&local_38,(is_method *)&fset);
  local_50.pm = pm;
  is_method::is_method(&local_58,(handle *)this);
  cpp_function::
  cpp_function<pybind11::class_<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>>::def_readwrite<asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>,std::array<std::vector<asd::Frame<short,asd::container::vec>,std::allocator<asd::Frame<short,asd::container::vec>>>,2ul>,char_const*>(char_const*,std::array<std::vector<asd::Frame<short,asd::container::vec>,std::allocator<asd::Frame<short,asd::container::vec>>>,2ul>asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>::*,char_const*const&)::_lambda(asd::Data<short,asd::channel<2ul>,asd::version<0ul>,asd::container::vec>&,std::array<std::vector<asd::Frame<short,asd::container::vec>,std::allocator<asd::Frame<short,asd::container::vec>>>,2ul>const&)_1_,pybind11::is_method,void>
            (&local_48,&local_50,&local_58);
  local_65[0] = reference_internal;
  def_property<pybind11::return_value_policy,char_const*>
            (this,name,&local_30,&local_48,local_65,
             (char **)fget.super_function.super_object.super_handle.m_ptr);
  cpp_function::~cpp_function(&local_48);
  cpp_function::~cpp_function(&local_30);
  return (class_<asd::Data<short,_asd::channel<2UL>,_asd::version<0UL>,_asd::container::vec>_> *)
         this;
}

Assistant:

class_ &def_readwrite(const char *name, D C::*pm, const Extra &...extra) {
        static_assert(std::is_same<C, type>::value || std::is_base_of<C, type>::value,
                      "def_readwrite() requires a class member (or base class member)");
        cpp_function fget([pm](const type &c) -> const D & { return c.*pm; }, is_method(*this)),
            fset([pm](type &c, const D &value) { c.*pm = value; }, is_method(*this));
        def_property(name, fget, fset, return_value_policy::reference_internal, extra...);
        return *this;
    }